

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entt.hpp
# Opt level: O3

object_type * __thiscall
entt::basic_storage<entt::entity,Transform,void>::construct<Transform_const&>
          (basic_storage<entt::entity,Transform,void> *this,entity_type entt,Transform *args)

{
  iterator __position;
  undefined8 uVar1;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar2;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar3;
  
  __position._M_current = *(Transform **)(this + 0x40);
  if (__position._M_current == *(Transform **)(this + 0x48)) {
    std::vector<Transform,std::allocator<Transform>>::_M_realloc_insert<Transform_const&>
              ((vector<Transform,std::allocator<Transform>> *)(this + 0x38),__position,args);
  }
  else {
    aVar2 = (args->m_scale).field_2;
    ((__position._M_current)->m_scale).field_1 = (args->m_scale).field_1;
    ((__position._M_current)->m_scale).field_2 = aVar2;
    aVar3 = (args->m_position).field_1;
    uVar1 = *(undefined8 *)&(args->m_position).field_2;
    ((__position._M_current)->m_position).field_0 = (args->m_position).field_0;
    ((__position._M_current)->m_position).field_1 = aVar3;
    *(undefined8 *)&((__position._M_current)->m_position).field_2 = uVar1;
    *(long *)(this + 0x40) = *(long *)(this + 0x40) + 0x18;
  }
  sparse_set<entt::entity>::construct((sparse_set<entt::entity> *)this,entt);
  return (object_type *)(*(long *)(this + 0x40) + -0x18);
}

Assistant:

object_type & construct(const entity_type entt, Args &&... args) {
        if constexpr(std::is_aggregate_v<object_type>) {
            instances.emplace_back(Type{std::forward<Args>(args)...});
        } else {
            instances.emplace_back(std::forward<Args>(args)...);
        }

        // entity goes after component in case constructor throws
        underlying_type::construct(entt);
        return instances.back();
    }